

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::CharSet<unsigned_int>::Clear(CharSet<unsigned_int> *this,ArenaAllocator *allocator)

{
  int local_1c;
  int i;
  ArenaAllocator *allocator_local;
  CharSet<unsigned_int> *this_local;
  
  for (local_1c = 0; local_1c < 0x11; local_1c = local_1c + 1) {
    CharSet<char16_t>::Clear(this->characterPlanes + local_1c,allocator);
  }
  return;
}

Assistant:

void CharSet<codepoint_t>::Clear(ArenaAllocator* allocator)
    {
        for (int i = 0; i < NumberOfPlanes; i++)
        {
            this->characterPlanes[i].Clear(allocator);
        }
    }